

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

pair<int,_double>
jsoncons::decode_traits<std::pair<int,double>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  int iVar3;
  basic_staj_event<char> *pbVar4;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_RDX;
  error_code *in_RSI;
  long *in_RDI;
  double *__y;
  pair<int,_double> pVar5;
  double v2;
  int v1;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  conv_errc __e;
  pair<int,_double> local_10;
  
  (**(code **)(*in_RDI + 0x10))(in_RDI,in_RDX);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RDX);
  if (bVar1) {
    std::pair<int,_double>::pair<int,_double,_true>(&local_10);
  }
  else {
    pbVar4 = (basic_staj_event<char> *)(**(code **)(*in_RDI + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar4);
    if (sVar2 == begin_array) {
      (**(code **)(*in_RDI + 0x40))(in_RDI,in_RDX);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RDX);
      if (bVar1) {
        std::pair<int,_double>::pair<int,_double,_true>(&local_10);
      }
      else {
        iVar3 = decode_traits<int,char,void>::
                decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                          ((basic_staj_cursor<char> *)in_RSI,in_RDX,
                           (error_code *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RDX);
        if (bVar1) {
          std::pair<int,_double>::pair<int,_double,_true>(&local_10);
        }
        else {
          (**(code **)(*in_RDI + 0x40))(in_RDI,in_RDX);
          bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RDX);
          if (bVar1) {
            std::pair<int,_double>::pair<int,_double,_true>(&local_10);
          }
          else {
            __y = (double *)
                  decode_traits<double,char,void>::
                  decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                            ((basic_staj_cursor<char> *)in_RSI,in_RDX,
                             (error_code *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
            bVar1 = std::error_code::operator_cast_to_bool((error_code *)in_RDX);
            if (bVar1) {
              std::pair<int,_double>::pair<int,_double,_true>(&local_10);
            }
            else {
              (**(code **)(*in_RDI + 0x40))(in_RDI,in_RDX);
              __e = (conv_errc)((ulong)in_RDX >> 0x20);
              pbVar4 = (basic_staj_event<char> *)(**(code **)(*in_RDI + 0x20))();
              sVar2 = basic_staj_event<char>::event_type(pbVar4);
              if (sVar2 == end_array) {
                pVar5 = std::make_pair<int&,double&>
                                  ((int *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),__y);
                local_10.second = pVar5.second;
                local_10.first = pVar5.first;
              }
              else {
                std::error_code::operator=(in_RSI,__e);
                std::pair<int,_double>::pair<int,_double,_true>(&local_10);
              }
            }
          }
        }
      }
    }
    else {
      std::error_code::operator=(in_RSI,(conv_errc)((ulong)in_RDX >> 0x20));
      std::pair<int,_double>::pair<int,_double,_true>(&local_10);
    }
  }
  pVar5._4_4_ = 0;
  pVar5.first = local_10.first;
  pVar5.second = local_10.second;
  return pVar5;
}

Assistant:

static std::pair<T1, T2> decode(basic_staj_cursor<CharT>& cursor,
            json_decoder<Json, TempAllocator>& decoder,
            std::error_code& ec)
        {
            using value_type = std::pair<T1, T2>;
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            cursor.next(ec); // skip past array
            if (JSONCONS_UNLIKELY(ec))
            {
                return value_type();
            }

            T1 v1 = decode_traits<T1,CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            T2 v2 = decode_traits<T2, CharT>::decode(cursor, decoder, ec);
            if (JSONCONS_UNLIKELY(ec)) {return value_type();}
            cursor.next(ec);

            if (cursor.current().event_type() != staj_event_type::end_array)
            {
                ec = conv_errc::not_pair;
                return value_type();
            }
            return std::make_pair(v1, v2);
        }